

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O2

void jaegertracing::sampling_manager::thrift::swap
               (SamplingStrategyResponse *a,SamplingStrategyResponse *b)

{
  double dVar1;
  _SamplingStrategyResponse__isset _Var2;
  int16_t iVar3;
  type tVar4;
  
  tVar4 = a->strategyType;
  a->strategyType = b->strategyType;
  b->strategyType = tVar4;
  dVar1 = (a->probabilisticSampling).samplingRate;
  (a->probabilisticSampling).samplingRate = (b->probabilisticSampling).samplingRate;
  (b->probabilisticSampling).samplingRate = dVar1;
  iVar3 = (a->rateLimitingSampling).maxTracesPerSecond;
  (a->rateLimitingSampling).maxTracesPerSecond = (b->rateLimitingSampling).maxTracesPerSecond;
  (b->rateLimitingSampling).maxTracesPerSecond = iVar3;
  swap(&a->operationSampling,&b->operationSampling);
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(SamplingStrategyResponse &a, SamplingStrategyResponse &b) {
  using ::std::swap;
  swap(a.strategyType, b.strategyType);
  swap(a.probabilisticSampling, b.probabilisticSampling);
  swap(a.rateLimitingSampling, b.rateLimitingSampling);
  swap(a.operationSampling, b.operationSampling);
  swap(a.__isset, b.__isset);
}